

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall cab_provision_complex6::test_method(cab_provision_complex6 *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  unit_test_log_t *this_01;
  bool bVar1;
  element_type *peVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a0;
  id_type local_180;
  id_type local_17c;
  undefined1 local_175 [5];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  local_170;
  assertion_result local_168;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  undefined1 local_130 [8];
  shared_ptr<cab> c;
  shared_ptr<cab> c2;
  shared_ptr<cab> c1;
  undefined1 local_f8 [6];
  node_type dst;
  node_type src;
  weak_ptr<cab_session> local_d8;
  undefined1 local_c8 [8];
  shared_ptr<cab_session> session;
  cab_manager manager;
  cab_provision_complex6 *this_local;
  
  this_00 = &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cab_manager::cab_manager((cab_manager *)this_00);
  std::shared_ptr<cab_session>::shared_ptr((shared_ptr<cab_session> *)local_c8,(nullptr_t)0x0);
  std::weak_ptr<cab_session>::weak_ptr<cab_session,void>
            (&local_d8,(shared_ptr<cab_session> *)local_c8);
  cab_manager::create((cab_manager *)this_00,&local_d8);
  std::weak_ptr<cab_session>::~weak_ptr(&local_d8);
  std::weak_ptr<cab_session>::weak_ptr<cab_session,void>
            ((weak_ptr<cab_session> *)local_f8,(shared_ptr<cab_session> *)local_c8);
  cab_manager::create((cab_manager *)
                      &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(weak_ptr<cab_session> *)local_f8);
  std::weak_ptr<cab_session>::~weak_ptr((weak_ptr<cab_session> *)local_f8);
  cab_manager::find_cab
            ((cab_manager *)&c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)&session + P3,P0,8);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::add_request(peVar2,P0,P3,4);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,P0);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,I1);
  cab_manager::find_cab
            ((cab_manager *)&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (char)&session + P3,P0,6);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::add_request(peVar2,P0,P2,4);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,I2);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,P2);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,P0);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,I1);
  peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab::update_position(peVar2,I2);
  cab_manager::find_cab((cab_manager *)local_130,(char)&session + P3,P2,8);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_150);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_01,&local_140,0x1cc,&local_150);
    peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_130);
    local_17c = cab::id(peVar2);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_175 + 1),(uint *)local_175);
    peVar2 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_180 = cab::id(peVar2);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<unsigned_int>,unsigned_int>
                *)&local_170,(uint *)(local_175 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
    ::evaluate(&local_168,&local_170,false);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,"c->id() == c2->id()",0x13);
    boost::unit_test::operator<<(&local_1a0,prev,&local_1b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_168,&local_1a0.super_lazy_ostream,&local_1c0,0x1cc,CHECK,CHECK_BUILT_ASSERTION
               ,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a0);
    boost::test_tools::assertion_result::~assertion_result(&local_168);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)local_130);
  std::shared_ptr<cab>::~shared_ptr
            ((shared_ptr<cab> *)&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<cab>::~shared_ptr
            ((shared_ptr<cab> *)&c2.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_c8);
  cab_manager::~cab_manager
            ((cab_manager *)
             &session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_complex6)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;
    
    manager.create(session);
    manager.create(session);

    node_type src = node_type::P0;
    node_type dst = node_type::P3;

    std::shared_ptr<cab> c1 = manager.find_cab(src, dst, 4);
    c1->add_request(src, dst, 4);

    c1->update_position(node_type::P0);
    c1->update_position(node_type::I1);

    src = node_type::P0;
    dst = node_type::P2;
    std::shared_ptr<cab> c2 = manager.find_cab(src, dst, 4);
    c2->add_request(src, dst, 4);

    c1->update_position(node_type::I2);
    c1->update_position(node_type::P2);

    c2->update_position(node_type::P0);
    c2->update_position(node_type::I1);
    c2->update_position(node_type::I2); 

    src = node_type::P2;
    dst = node_type::P3;
    std::shared_ptr<cab> c = manager.find_cab(src, dst, 1);

    BOOST_TEST(c->id() == c2->id());
}